

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<int>::Truncate(RepeatedField<int> *this,int new_size)

{
  LogMessage *other;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  int local_14;
  RepeatedField<int> *pRStack_10;
  int new_size_local;
  RepeatedField<int> *this_local;
  
  local_51 = 0;
  local_14 = new_size;
  pRStack_10 = this;
  if (this->current_size_ < new_size) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x3bd);
    local_51 = 1;
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (new_size) <= (current_size_): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (0 < this->current_size_) {
    this->current_size_ = local_14;
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::Truncate(int new_size) {
  GOOGLE_DCHECK_LE(new_size, current_size_);
  if (current_size_ > 0) {
    current_size_ = new_size;
  }
}